

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O1

uint RDL_getRCPrototypes(RDL_data *data,RDL_cycle ***ptr)

{
  uint uVar1;
  RDL_BCCGraph *pRVar2;
  uint *puVar3;
  RDL_URFinfo **ppRVar4;
  char *pcVar5;
  RDL_graph *pRVar6;
  RDL_node *pRVar7;
  RDL_cycle **ppRVar8;
  RDL_URFinfo *pRVar9;
  RDL_cycle *pRVar10;
  RDL_edge *paRVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  
  if (data == (RDL_data *)0x0) {
    (*RDL_outputFunc)(RDL_ERROR,"RDL_data is NULL!\n");
    uVar16 = 0xffffffff;
  }
  else {
    if (data->nofURFs != 0) {
      pRVar2 = data->bccGraphs;
      if ((ulong)pRVar2->nof_bcc == 0) {
        uVar15 = 0;
      }
      else {
        uVar13 = 0;
        uVar15 = 0;
        do {
          if ((ulong)data->nofURFsPerBCC[uVar13] != 0) {
            uVar18 = 0;
            do {
              uVar15 = (ulong)((int)uVar15 + data->urfInfoPerBCC[uVar13]->nofCFsPerURF[uVar18]);
              uVar18 = uVar18 + 1;
            } while (data->nofURFsPerBCC[uVar13] != uVar18);
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != pRVar2->nof_bcc);
      }
      uVar16 = (uint)uVar15;
      ppRVar8 = (RDL_cycle **)malloc(uVar15 << 3);
      if (pRVar2->nof_bcc != 0) {
        puVar3 = data->nofURFsPerBCC;
        uVar15 = 0;
        uVar12 = 0;
        uVar19 = 0;
        do {
          uVar1 = puVar3[uVar15];
          if ((ulong)uVar1 != 0) {
            ppRVar4 = data->urfInfoPerBCC;
            uVar13 = 0;
            do {
              pRVar9 = ppRVar4[uVar15];
              if (pRVar9->nofCFsPerURF[uVar13] != 0) {
                uVar18 = 0;
                do {
                  pcVar5 = pRVar9->URFs[uVar13][uVar18]->prototype;
                  pRVar10 = (RDL_cycle *)malloc(0x18);
                  ppRVar8[uVar12] = pRVar10;
                  paRVar11 = (RDL_edge *)
                             malloc((ulong)ppRVar4[uVar15]->URFs[uVar13][uVar18]->weight << 3);
                  pRVar10->edges = paRVar11;
                  pRVar10->weight = ppRVar4[uVar15]->URFs[uVar13][uVar18]->weight;
                  pRVar10->urf = (uint)uVar13;
                  pRVar10->rcf = uVar19;
                  pRVar6 = pRVar2->bcc_graphs[uVar15];
                  if (pRVar6->E != 0) {
                    uVar14 = 0;
                    uVar17 = 0;
                    do {
                      if (pcVar5[uVar14] == '\x01') {
                        pRVar7 = data->graph->edges[pRVar2->edge_from_bcc_mapping[uVar15][uVar14]];
                        paRVar11[uVar17][0] = *pRVar7;
                        paRVar11[uVar17][1] = pRVar7[1];
                        uVar17 = (ulong)((int)uVar17 + 1);
                      }
                      uVar14 = uVar14 + 1;
                    } while (uVar14 < pRVar6->E);
                  }
                  uVar12 = uVar12 + 1;
                  uVar18 = uVar18 + 1;
                  uVar19 = uVar19 + 1;
                  pRVar9 = ppRVar4[uVar15];
                } while (uVar18 < pRVar9->nofCFsPerURF[uVar13]);
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 != uVar1);
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 < pRVar2->nof_bcc);
      }
      goto LAB_00107ed0;
    }
    uVar16 = 0;
  }
  ppRVar8 = (RDL_cycle **)malloc(8);
LAB_00107ed0:
  *ptr = ppRVar8;
  return uVar16;
}

Assistant:

unsigned RDL_getRCPrototypes(const RDL_data *data, RDL_cycle ***ptr)
{
  RDL_cycle **result;
  unsigned nof_urf;
  unsigned nofRel=0, rcf=0;
  unsigned currFam=0, currEdge;
  unsigned i,j,k;
  const char* prototype;
  unsigned bcc_index, mapped_edge;

  if (!data) {
    RDL_outputFunc(RDL_ERROR, "RDL_data is NULL!\n");
    (*ptr) = malloc(sizeof(**ptr));
    return RDL_INVALID_RESULT;
  }

  if (data->nofURFs < 1) {
    (*ptr) = malloc(sizeof(**ptr));
    return 0;
  }

  for (i = 0; i < data->bccGraphs->nof_bcc; ++i) {
    for (j = 0; j < data->nofURFsPerBCC[i]; ++j) {
      nofRel += data->urfInfoPerBCC[i]->nofCFsPerURF[j];
    }
  }

  /*allocate space*/
  result = malloc(nofRel * sizeof(*result));

  for (bcc_index = 0; bcc_index < data->bccGraphs->nof_bcc; ++bcc_index) {
    nof_urf = data->nofURFsPerBCC[bcc_index];
    for (i = 0; i < nof_urf; ++i) {
      for (j = 0; j < data->urfInfoPerBCC[bcc_index]->nofCFsPerURF[i]; ++j, ++rcf) {
        prototype = data->urfInfoPerBCC[bcc_index]->URFs[i][j]->prototype;
        result[currFam] = malloc(sizeof(**result));
        result[currFam]->edges = malloc(data->urfInfoPerBCC[bcc_index]->URFs[i][j]->weight *
                                  sizeof(*result[currFam]->edges));
        result[currFam]->weight = data->urfInfoPerBCC[bcc_index]->URFs[i][j]->weight;
        result[currFam]->urf = i;
        result[currFam]->rcf = rcf;
        currEdge = 0;
        for (k = 0; k < data->bccGraphs->bcc_graphs[bcc_index]->E; ++k) {
          if (prototype[k] == 1) {
            mapped_edge = data->bccGraphs->edge_from_bcc_mapping[bcc_index][k];
            result[currFam]->edges[currEdge][0] = data->graph->edges[mapped_edge][0];
            result[currFam]->edges[currEdge][1] = data->graph->edges[mapped_edge][1];
            ++currEdge;
          }
        }
        ++currFam;
      }
    }
  }

  (*ptr) = result;
  return nofRel;
}